

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

vector<S2LatLng,_std::allocator<S2LatLng>_> * __thiscall
s2textformat::ParseLatLngsOrDie
          (vector<S2LatLng,_std::allocator<S2LatLng>_> *__return_storage_ptr__,s2textformat *this,
          string_view str)

{
  string_view str_00;
  bool bVar1;
  ostream *poVar2;
  absl *this_00;
  size_type sVar3;
  string_view piece;
  S2LogMessage local_58;
  S2LogMessageVoidify local_45 [13];
  s2textformat *local_38;
  char *pcStack_30;
  undefined1 local_21;
  s2textformat *psStack_20;
  string_view str_local;
  vector<S2LatLng,_std::allocator<S2LatLng>_> *latlngs;
  
  str_local.ptr_ = str.ptr_;
  local_21 = 0;
  psStack_20 = this;
  str_local.length_ = (size_type)__return_storage_ptr__;
  std::vector<S2LatLng,_std::allocator<S2LatLng>_>::vector(__return_storage_ptr__);
  local_38 = psStack_20;
  pcStack_30 = str_local.ptr_;
  str_00.length_ = (size_type)str_local.ptr_;
  str_00.ptr_ = (char *)psStack_20;
  bVar1 = ParseLatLngs(str_00,__return_storage_ptr__);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return __return_storage_ptr__;
  }
  sVar3 = 3;
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
             ,0x3e,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_58);
  poVar2 = std::operator<<(poVar2,"Check failed: ParseLatLngs(str, &latlngs) ");
  this_00 = (absl *)std::operator<<(poVar2,": str == \"");
  piece.length_ = sVar3;
  piece.ptr_ = str_local.ptr_;
  poVar2 = absl::operator<<(this_00,(ostream *)psStack_20,piece);
  poVar2 = std::operator<<(poVar2,"\"");
  S2LogMessageVoidify::operator&(local_45,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
}

Assistant:

vector<S2LatLng> ParseLatLngsOrDie(string_view str) {
  vector<S2LatLng> latlngs;
  S2_CHECK(ParseLatLngs(str, &latlngs)) << ": str == \"" << str << "\"";
  return latlngs;
}